

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O1

void vkt::api::anon_unknown_0::createImageFormatTests
               (TestCaseGroup *testGroup,Function testFunction)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestContext *pTVar3;
  ImageFormatPropertyCase arg0;
  ImageFormatPropertyCase arg0_00;
  ImageFormatPropertyCase arg0_01;
  TestNode *pTVar4;
  string local_b0;
  string local_90;
  Function local_70;
  undefined8 uStack_68;
  undefined4 local_60;
  undefined4 uStack_5c;
  Function local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  Function local_40;
  undefined8 uStack_38;
  undefined4 local_30;
  undefined4 uStack_2c;
  
  pTVar3 = (testGroup->super_TestNode).m_testCtx;
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"1d","");
  paVar2 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
  uStack_38 = 0;
  local_30 = 2;
  arg0._20_4_ = uStack_2c;
  arg0.tiling = 2;
  arg0.format = VK_FORMAT_UNDEFINED;
  arg0.imageType = VK_IMAGE_TYPE_1D;
  arg0.testFunction = testFunction;
  local_40 = testFunction;
  pTVar4 = &createTestGroup<vkt::api::(anonymous_namespace)::ImageFormatPropertyCase>
                      (pTVar3,&local_90,&local_b0,createImageFormatTypeTests,arg0)->super_TestNode;
  tcu::TestNode::addChild(&testGroup->super_TestNode,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (testGroup->super_TestNode).m_testCtx;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"2d","");
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
  uStack_50 = 0x100000000;
  local_48 = 2;
  arg0_00._20_4_ = uStack_44;
  arg0_00.tiling = 2;
  arg0_00.format = VK_FORMAT_UNDEFINED;
  arg0_00.imageType = VK_IMAGE_TYPE_2D;
  arg0_00.testFunction = testFunction;
  local_58 = testFunction;
  pTVar4 = &createTestGroup<vkt::api::(anonymous_namespace)::ImageFormatPropertyCase>
                      (pTVar3,&local_90,&local_b0,createImageFormatTypeTests,arg0_00)->
            super_TestNode;
  tcu::TestNode::addChild(&testGroup->super_TestNode,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (testGroup->super_TestNode).m_testCtx;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"3d","");
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
  uStack_68 = 0x200000000;
  local_60 = 2;
  arg0_01._20_4_ = uStack_5c;
  arg0_01.tiling = 2;
  arg0_01.format = VK_FORMAT_UNDEFINED;
  arg0_01.imageType = VK_IMAGE_TYPE_3D;
  arg0_01.testFunction = testFunction;
  local_70 = testFunction;
  pTVar4 = &createTestGroup<vkt::api::(anonymous_namespace)::ImageFormatPropertyCase>
                      (pTVar3,&local_90,&local_b0,createImageFormatTypeTests,arg0_01)->
            super_TestNode;
  tcu::TestNode::addChild(&testGroup->super_TestNode,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void createImageFormatTests (tcu::TestCaseGroup* testGroup, ImageFormatPropertyCase::Function testFunction)
{
	testGroup->addChild(createTestGroup(testGroup->getTestContext(), "1d", "", createImageFormatTypeTests, ImageFormatPropertyCase(testFunction, VK_FORMAT_UNDEFINED, VK_IMAGE_TYPE_1D, VK_IMAGE_TILING_LAST)));
	testGroup->addChild(createTestGroup(testGroup->getTestContext(), "2d", "", createImageFormatTypeTests, ImageFormatPropertyCase(testFunction, VK_FORMAT_UNDEFINED, VK_IMAGE_TYPE_2D, VK_IMAGE_TILING_LAST)));
	testGroup->addChild(createTestGroup(testGroup->getTestContext(), "3d", "", createImageFormatTypeTests, ImageFormatPropertyCase(testFunction, VK_FORMAT_UNDEFINED, VK_IMAGE_TYPE_3D, VK_IMAGE_TILING_LAST)));
}